

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_declare_const
          (irGenerator *this,string *name,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *values,int id)

{
  mapped_type *this_00;
  GlobalValue globalValue;
  string local_b0;
  string local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  undefined1 local_58 [56];
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,values);
  arm::ConstValue::ConstValue
            ((ConstValue *)local_58,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70
             ,(optional<int>)0x0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
  std::__cxx11::string::string((string *)&local_b0,(string *)name);
  getConstName(&local_90,this,&local_b0,id);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
            ::operator[](&(this->_package).global_values,&local_90);
  arm::ConstValue::operator=(this_00,(ConstValue *)local_58);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__detail::__variant::
  _Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_58 + 8));
  return;
}

Assistant:

void irGenerator::ir_declare_const(string name,
                                   std::vector<std::uint32_t> values, int id) {
  GlobalValue globalValue = GlobalValue(values);
  _package.global_values[getConstName(name, id)] = globalValue;
}